

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

TestMatrixType deqp::gles2::Functional::MatrixCaseUtils::getOperationTestMatrixType(MatrixOp op)

{
  TestMatrixType local_c;
  MatrixOp op_local;
  
  switch(op) {
  case OP_ADD:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_SUB:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_MUL:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_DIV:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_COMP_MUL:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_UNARY_PLUS:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_NEGATION:
    local_c = TESTMATRIXTYPE_NEGATED;
    break;
  case OP_PRE_INCREMENT:
    local_c = TESTMATRIXTYPE_NEGATED;
    break;
  case OP_PRE_DECREMENT:
    local_c = TESTMATRIXTYPE_INCREMENTED;
    break;
  case OP_POST_INCREMENT:
    local_c = TESTMATRIXTYPE_NEGATED;
    break;
  case OP_POST_DECREMENT:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_ADD_INTO:
    local_c = TESTMATRIXTYPE_DECREMENTED;
    break;
  case OP_SUBTRACT_FROM:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_MULTIPLY_INTO:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  case OP_DIVIDE_INTO:
    local_c = TESTMATRIXTYPE_DEFAULT;
    break;
  default:
    local_c = TESTMATRIXTYPE_LAST;
  }
  return local_c;
}

Assistant:

static TestMatrixType getOperationTestMatrixType (MatrixOp op)
{
	switch(op)
	{
		case OP_ADD:			return TESTMATRIXTYPE_DEFAULT;
		case OP_SUB:			return TESTMATRIXTYPE_DEFAULT;
		case OP_MUL:			return TESTMATRIXTYPE_DEFAULT;
		case OP_DIV:			return TESTMATRIXTYPE_DEFAULT;
		case OP_COMP_MUL:		return TESTMATRIXTYPE_DEFAULT;
		case OP_UNARY_PLUS:		return TESTMATRIXTYPE_DEFAULT;
		case OP_NEGATION:		return TESTMATRIXTYPE_NEGATED;
		case OP_PRE_INCREMENT:	return TESTMATRIXTYPE_NEGATED;
		case OP_PRE_DECREMENT:	return TESTMATRIXTYPE_INCREMENTED;
		case OP_POST_INCREMENT:	return TESTMATRIXTYPE_NEGATED;
		case OP_POST_DECREMENT:	return TESTMATRIXTYPE_DEFAULT;
		case OP_ADD_INTO:		return TESTMATRIXTYPE_DECREMENTED;
		case OP_SUBTRACT_FROM:	return TESTMATRIXTYPE_DEFAULT;
		case OP_MULTIPLY_INTO:	return TESTMATRIXTYPE_DEFAULT;
		case OP_DIVIDE_INTO:	return TESTMATRIXTYPE_DEFAULT;

		default:
			DE_ASSERT(DE_FALSE);
			return TESTMATRIXTYPE_LAST;
	}
}